

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O0

wchar_t mon_create_drop_count(monster_race *race,_Bool maximize,_Bool specific,int *specific_count)

{
  _Bool _Var1;
  int iVar2;
  uint32_t uVar3;
  monster_drop *local_30;
  monster_drop *drop;
  wchar_t specnum;
  wchar_t number;
  int *specific_count_local;
  _Bool specific_local;
  _Bool maximize_local;
  monster_race *race_local;
  
  drop._4_4_ = L'\0';
  drop._0_4_ = 0;
  if (maximize) {
    _Var1 = flag_has_dbg(race->flags,0xb,0x27,"race->flags","RF_DROP_20");
    drop._4_4_ = (wchar_t)_Var1;
    _Var1 = flag_has_dbg(race->flags,0xb,0x1f,"race->flags","RF_DROP_40");
    if (_Var1) {
      drop._4_4_ = drop._4_4_ + L'\x01';
    }
    _Var1 = flag_has_dbg(race->flags,0xb,0x20,"race->flags","RF_DROP_60");
    if (_Var1) {
      drop._4_4_ = drop._4_4_ + L'\x01';
    }
    _Var1 = flag_has_dbg(race->flags,0xb,0x24,"race->flags","RF_DROP_4");
    if (_Var1) {
      drop._4_4_ = drop._4_4_ + L'\x06';
    }
    _Var1 = flag_has_dbg(race->flags,0xb,0x23,"race->flags","RF_DROP_3");
    if (_Var1) {
      drop._4_4_ = drop._4_4_ + L'\x04';
    }
    _Var1 = flag_has_dbg(race->flags,0xb,0x22,"race->flags","RF_DROP_2");
    if (_Var1) {
      drop._4_4_ = drop._4_4_ + L'\x03';
    }
    _Var1 = flag_has_dbg(race->flags,0xb,0x21,"race->flags","RF_DROP_1");
    if (_Var1) {
      drop._4_4_ = drop._4_4_ + L'\x01';
    }
    for (local_30 = race->drops; local_30 != (monster_drop *)0x0; local_30 = local_30->next) {
      drop._0_4_ = local_30->max + (int)drop;
    }
  }
  else {
    _Var1 = flag_has_dbg(race->flags,0xb,0x27,"race->flags","RF_DROP_20");
    if ((_Var1) && (uVar3 = Rand_div(100), (int)uVar3 < 0x14)) {
      drop._4_4_ = L'\x01';
    }
    _Var1 = flag_has_dbg(race->flags,0xb,0x1f,"race->flags","RF_DROP_40");
    if ((_Var1) && (uVar3 = Rand_div(100), (int)uVar3 < 0x28)) {
      drop._4_4_ = drop._4_4_ + L'\x01';
    }
    _Var1 = flag_has_dbg(race->flags,0xb,0x20,"race->flags","RF_DROP_60");
    if ((_Var1) && (uVar3 = Rand_div(100), (int)uVar3 < 0x3c)) {
      drop._4_4_ = drop._4_4_ + L'\x01';
    }
    _Var1 = flag_has_dbg(race->flags,0xb,0x24,"race->flags","RF_DROP_4");
    if (_Var1) {
      iVar2 = rand_range(2,6);
      drop._4_4_ = iVar2 + drop._4_4_;
    }
    _Var1 = flag_has_dbg(race->flags,0xb,0x23,"race->flags","RF_DROP_3");
    if (_Var1) {
      iVar2 = rand_range(2,4);
      drop._4_4_ = iVar2 + drop._4_4_;
    }
    _Var1 = flag_has_dbg(race->flags,0xb,0x22,"race->flags","RF_DROP_2");
    if (_Var1) {
      iVar2 = rand_range(1,3);
      drop._4_4_ = iVar2 + drop._4_4_;
    }
    _Var1 = flag_has_dbg(race->flags,0xb,0x21,"race->flags","RF_DROP_1");
    if (_Var1) {
      drop._4_4_ = drop._4_4_ + L'\x01';
    }
    for (local_30 = race->drops; local_30 != (monster_drop *)0x0; local_30 = local_30->next) {
      uVar3 = Rand_div(100);
      if (uVar3 < local_30->percent_chance) {
        uVar3 = Rand_div(local_30->max - local_30->min);
        drop._0_4_ = uVar3 + local_30->min + (int)drop;
      }
    }
  }
  if (specific) {
    drop._4_4_ = (int)drop + drop._4_4_;
  }
  if (specific_count != (int *)0x0) {
    *specific_count = (int)drop;
  }
  return drop._4_4_;
}

Assistant:

int mon_create_drop_count(const struct monster_race *race, bool maximize,
	bool specific, int *specific_count)
{
	int number = 0;
	int specnum = 0;
	static const int drop_4_max = 6;
	static const int drop_3_max = 4;
	static const int drop_2_max = 3;
	struct monster_drop *drop;

	if (maximize) {
		if (rf_has(race->flags, RF_DROP_20)) number++;
		if (rf_has(race->flags, RF_DROP_40)) number++;
		if (rf_has(race->flags, RF_DROP_60)) number++;
		if (rf_has(race->flags, RF_DROP_4)) number += drop_4_max;
		if (rf_has(race->flags, RF_DROP_3)) number += drop_3_max;
		if (rf_has(race->flags, RF_DROP_2)) number += drop_2_max;
		if (rf_has(race->flags, RF_DROP_1)) number++;
		for (drop = race->drops; drop; drop = drop->next) {
			specnum += drop->max;
		}
	} else {
		if (rf_has(race->flags, RF_DROP_20) && randint0(100) < 20) number++;
		if (rf_has(race->flags, RF_DROP_40) && randint0(100) < 40) number++;
		if (rf_has(race->flags, RF_DROP_60) && randint0(100) < 60) number++;
		if (rf_has(race->flags, RF_DROP_4)) number += rand_range(2, drop_4_max);
		if (rf_has(race->flags, RF_DROP_3)) number += rand_range(2, drop_3_max);
		if (rf_has(race->flags, RF_DROP_2)) number += rand_range(1, drop_2_max);
		if (rf_has(race->flags, RF_DROP_1)) number++;
		for (drop = race->drops; drop; drop = drop->next) {
			if ((unsigned int)randint0(100) <
					drop->percent_chance) {
				specnum += randint0(drop->max - drop->min) +
					drop->min;
			}
		}
	}
	if (specific) {
		number += specnum;
	}
	if (specific_count) {
		*specific_count = specnum;
	}
	return number;
}